

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.cpp
# Opt level: O1

void __thiscall dg::llvmdg::legacy::NTSCD::computeDependencies(NTSCD *this)

{
  StringRef SVar1;
  Function *llvmFunction;
  Function *this_00;
  Block *this_01;
  _Rb_tree_node_base *p_Var2;
  raw_ostream *prVar3;
  StringRef Str;
  StringRef Str_00;
  
  SVar1.Data = (char *)(this->super_LLVMControlDependenceAnalysisImpl)._module;
  SVar1.Length = *(size_t *)
                  &(this->super_LLVMControlDependenceAnalysisImpl)._options.
                   super_LLVMAnalysisOptions.entryFunction._M_dataplus;
  llvmFunction = (Function *)llvm::Module::getFunction(SVar1);
  if (llvmFunction == (Function *)0x0) {
    prVar3 = (raw_ostream *)llvm::errs();
    Str.Length = 0x18;
    Str.Data = "Missing entry function: ";
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
    prVar3 = (raw_ostream *)
             llvm::raw_ostream::write
                       ((char *)prVar3,
                        (ulong)(this->super_LLVMControlDependenceAnalysisImpl)._options.
                               super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p);
    Str_00.Length = 1;
    Str_00.Data = "\n";
    llvm::raw_ostream::operator<<(prVar3,Str_00);
    return;
  }
  GraphBuilder::buildFunction(&this->graphBuilder,llvmFunction,true);
  this_00 = GraphBuilder::findFunction(&this->graphBuilder,llvmFunction);
  this_01 = Function::entry(this_00);
  Block::visit(this_01);
  for (p_Var2 = (this->graphBuilder)._functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var2 !=
        &(this->graphBuilder)._functions._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    computeDependencies(this,(Function *)p_Var2[1]._M_parent);
  }
  return;
}

Assistant:

void NTSCD::computeDependencies() {
    DBG_SECTION_BEGIN(cda, "Computing CD for the whole module");
    auto *entryFunction = getModule()->getFunction(getOptions().entryFunction);
    if (!entryFunction) {
        llvm::errs() << "Missing entry function: " << getOptions().entryFunction
                     << "\n";
        return;
    }

    graphBuilder.buildFunction(entryFunction, /* recursively = */ true);
    auto *entryFunc = graphBuilder.findFunction(entryFunction);

    entryFunc->entry()->visit();

    for (const auto &it : graphBuilder.functions()) {
        computeDependencies(it.second);
    }
    DBG_SECTION_END(cda, "Finished computing CD for the whole module");
}